

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::T_formatter<spdlog::details::scoped_padder>::format
          (T_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char local_66 [14];
  undefined1 local_58 [8];
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  T_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = 8;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,8,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2(tm_time->tm_hour,dest);
  local_66[1] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_66 + 1);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_66[0] = ':';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_66);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }